

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiplyexpression.cpp
# Opt level: O2

void __thiscall MultiplyExpression::interpret(MultiplyExpression *this,Context *context)

{
  int iVar1;
  string *this_00;
  allocator<char> local_89;
  string local_88 [32];
  char buf [64];
  
  (*context->_vptr_Context[2])((string *)buf);
  iVar1 = atoi((char *)buf._0_8_);
  std::__cxx11::string::~string((string *)buf);
  sprintf(buf,"%d",(ulong)(uint)(iVar1 * this->_muled));
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>(this_00,buf,&local_89);
  std::__cxx11::string::string(local_88,this_00);
  (*context->_vptr_Context[3])(context,local_88);
  std::__cxx11::string::~string(local_88);
  return;
}

Assistant:

void MultiplyExpression::interpret(Context& context)
{
	int num = atoi(context.data().c_str());
	char buf[64];

	num *= _muled;

	sprintf(buf, "%d", num);

	context.setData(*(new string(buf)));
}